

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O1

interval_t duckdb::ToQuartersOperator::Operation<int,duckdb::interval_t>(int input)

{
  bool bVar1;
  OutOfRangeException *this;
  undefined1 auVar2 [12];
  int result_1;
  interval_t result;
  int32_t local_5c;
  uint local_58 [4];
  string local_48;
  
  bVar1 = TryCast::Operation<int,int>(input,&local_5c,false);
  if (!bVar1) {
    auVar2 = __cxa_allocate_exception(0x10);
    CastExceptionText<int,int>(&local_48,(duckdb *)(ulong)(uint)input,auVar2._8_4_);
    InvalidInputException::InvalidInputException(auVar2._0_8_,(string *)&local_48);
    __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = TryMultiplyOperator::Operation<int,int,int>(local_5c,3,(int32_t *)local_58);
  if (bVar1) {
    return (interval_t)ZEXT416(local_58[0]);
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Interval value %d quarters out of range","");
  OutOfRangeException::OutOfRangeException<int>(this,&local_48,input);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input) {
		const auto iinput = Cast::Operation<TA, int32_t>(input);
		interval_t result;
		if (!TryMultiplyOperator::Operation<int32_t, int32_t, int32_t>(iinput, Interval::MONTHS_PER_QUARTER,
		                                                               result.months)) {
			throw OutOfRangeException("Interval value %d quarters out of range", input);
		}
		result.days = 0;
		result.micros = 0;
		return result;
	}